

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db.cpp
# Opt level: O3

void __thiscall Database_Trailer_Test::~Database_Trailer_Test(Database_Trailer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Database, Trailer) {
    using ::testing::_;
    using ::testing::ElementsAre;
    using ::testing::ElementsAreArray;

    std::ostringstream out;
    pstore::dump::value_ptr addr = pstore::dump::make_value (pstore::trailer{}, false /*no_times*/);
    addr->write (out);

    auto const lines = split_lines (out.str ());
    ASSERT_EQ (8U, lines.size ());

    auto line = 0U;
    EXPECT_THAT (split_tokens (lines.at (line++)),
                 ElementsAreArray (std::vector<std::string>{"signature1", ":", "[", "0x68,",
                                                            "0x50,", "0x50,", "0x79,", "0x66,",
                                                            "0x6f,", "0x6f,", "0x54", "]"}));
    EXPECT_THAT (split_tokens (lines.at (line++)), ElementsAre ("generation", ":", "0x0"));
    EXPECT_THAT (split_tokens (lines.at (line++)), ElementsAre ("size", ":", "0x0"));
    EXPECT_THAT (split_tokens (lines.at (line++)),
                 ElementsAre ("time", ":", "1970-01-01T00:00:00Z"));

    EXPECT_THAT (split_tokens (lines.at (line++)), ElementsAre ("prev_generation", ":", "0x0"));
    EXPECT_THAT (
        split_tokens (lines.at (line++)),
        ElementsAre ("indices", ":", "[", "0x0,", "0x0,", "0x0,", "0x0,", "0x0,", "0x0", "]"));

    EXPECT_THAT (split_tokens (lines.at (line++)), ElementsAre ("crc", ":", _));
    EXPECT_THAT (split_tokens (lines.at (line++)),
                 ElementsAreArray (std::vector<std::string>{"signature2", ":", "[", "0x68,",
                                                            "0x50,", "0x50,", "0x79,", "0x54,",
                                                            "0x61,", "0x69,", "0x6c", "]"}));
}